

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::NodeTranslator::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,NodeTranslator *this,
          Reader filename)

{
  Resolver *pRVar1;
  ErrorReporter *this_00;
  char *pcVar2;
  StringPtr message;
  Reader RVar3;
  NullableValue<kj::Array<const_unsigned_char>_> local_78;
  NullableValue<kj::Array<const_unsigned_char>_> local_58;
  ArrayPtr<const_char> local_38;
  
  pRVar1 = this->resolver;
  RVar3 = LocatedText::Reader::getValue(&filename);
  (*pRVar1->_vptr_Resolver[9])
            (&local_58,pRVar1,RVar3.super_StringPtr.content.ptr,RVar3.super_StringPtr.content.size_)
  ;
  local_78.isSet = local_58.isSet;
  if (local_58.isSet == true) {
    local_78.field_1.value.ptr = local_58.field_1.value.ptr;
    local_78.field_1.value.size_ = local_58.field_1.value.size_;
    local_78.field_1.value.disposer = local_58.field_1.value.disposer;
    local_58.field_1.value.ptr = (uchar *)0x0;
    local_58.field_1.value.size_ = 0;
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_58);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = local_78.field_1.value.ptr;
    (__return_storage_ptr__->ptr).field_1.value.size_ = local_78.field_1.value.size_;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_78.field_1.value.disposer;
    local_78.field_1.value.ptr = (uchar *)0x0;
    local_78.field_1.value.size_ = 0;
  }
  else {
    kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_58);
    this_00 = this->errorReporter;
    local_38 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&filename);
    kj::str<char_const(&)[31],capnp::Text::Reader>
              ((String *)&local_58,(kj *)"Couldn\'t read file for embed: ",(char (*) [31])&local_38,
               (Reader *)&local_38);
    if (local_58.field_1.value.ptr == (uchar *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)CONCAT71(local_58._1_7_,local_58.isSet);
    }
    message.content.size_ =
         local_58.field_1.value.ptr + (local_58.field_1.value.ptr == (uchar *)0x0);
    message.content.ptr = pcVar2;
    ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(this_00,&filename,message);
    kj::Array<char>::~Array((Array<char> *)&local_58);
    (__return_storage_ptr__->ptr).isSet = false;
  }
  kj::_::NullableValue<kj::Array<const_unsigned_char>_>::~NullableValue(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> NodeTranslator::readEmbed(LocatedText::Reader filename) {
  KJ_IF_SOME(data, resolver.readEmbed(filename.getValue())) {
    return kj::mv(data);
  } else {
    errorReporter.addErrorOn(filename,
        kj::str("Couldn't read file for embed: ", filename.getValue()));
    return kj::none;
  }